

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

TabularCPT * __thiscall
despot::Parser::CreateTabularStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  NamedVar *child_00;
  bool bVar1;
  int iVar2;
  TiXmlNode *pTVar3;
  mapped_type *ppVVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  TabularCPT *pTVar8;
  TiXmlElement *pTVar9;
  size_type sVar10;
  size_type t;
  char *__nptr;
  reference pvVar11;
  double dVar12;
  pointer local_4c8;
  bool local_462;
  allocator<char> local_421;
  string local_420;
  undefined1 local_3fd;
  int local_3fc;
  undefined1 local_3f8 [3];
  bool success;
  int i_3;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  int local_2f0;
  int local_2ec;
  int j;
  int i_2;
  int local_2dc;
  int local_2d8;
  int i_1;
  int num;
  int num_entries;
  string table;
  vector<double,_std::allocator<double>_> values;
  string local_290;
  string local_270;
  undefined1 local_250 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  TiXmlElement *e_Entry;
  TiXmlElement *e_Parameter;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_220;
  TabularCPT *local_208;
  TabularCPT *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  byte local_1b1;
  string local_1b0;
  byte local_189;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  string parent_name;
  int i;
  string local_100;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  StateVar *child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_58;
  undefined1 local_38 [8];
  string name;
  TiXmlElement *e_CondProb_local;
  Parser *this_local;
  
  name.field_2._8_8_ = e_CondProb;
  GetFirstChildText_abi_cxx11_((string *)local_38,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_58,(string *)local_38);
  bVar1 = Variable::IsVariableName(&local_58,&this->curr_state_vars_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 "In <StateTransitionFunction>: Var ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 " has not been declared as a StateVar vnameCurr within the <Variable> tag.");
  pTVar3 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Var");
  Ensure(this,bVar1,&local_88,&pTVar3->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&child);
  std::__cxx11::string::~string((string *)&local_58);
  ppVVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,(key_type *)local_38);
  child_00 = (NamedVar *)*ppVVar4;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GetFirstChildText_abi_cxx11_(&local_100,this,(TiXmlElement *)name.field_2._8_8_,"Parent");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i," ",(allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e0,&local_100,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)(parent_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_100);
  for (parent_name.field_2._8_4_ = 0; uVar5 = (ulong)(int)parent_name.field_2._8_4_,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0), uVar5 < sVar6;
      parent_name.field_2._8_4_ = parent_name.field_2._8_4_ + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e0,(long)(int)parent_name.field_2._8_4_);
    std::__cxx11::string::string((string *)local_148,(string *)pvVar7);
    local_189 = 0;
    local_1b1 = 0;
    std::__cxx11::string::string((string *)&local_168,(string *)local_148);
    bVar1 = Variable::IsVariableName(&local_168,&this->prev_state_vars_);
    local_462 = true;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_188,(string *)local_148);
      local_189 = 1;
      bVar1 = Variable::IsVariableName(&local_188,&this->curr_state_vars_);
      local_462 = true;
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)local_148);
        local_1b1 = 1;
        local_462 = Variable::IsVariableName(&local_1b0,&this->action_vars_);
      }
    }
    std::operator+(&local_1f8,"In <StateTransitionFunction>: Parent ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
    std::operator+(&local_1d8,&local_1f8,
                   " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar3 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Parent");
    Ensure(this,local_462,&local_1d8,&pTVar3->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    if ((local_1b1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    if ((local_189 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    std::__cxx11::string::~string((string *)&local_168);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,(key_type *)local_148);
    func = (TabularCPT *)*ppVVar4;
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::push_back
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
               &parent_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&func);
    std::__cxx11::string::~string((string *)local_148);
  }
  pTVar8 = (TabularCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_220,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TabularCPT::TabularCPT(pTVar8,child_00,&local_220);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_220);
  local_208 = pTVar8;
  pTVar9 = GetParameterElement(this,(TiXmlElement *)name.field_2._8_8_);
  instance.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Entry");
  while (pTVar8 = local_208,
        instance.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    GetFirstChildText_abi_cxx11_
              (&local_270,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290," ",
               (allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_250,&local_270,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_270);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    GetFirstChildText_abi_cxx11_
              ((string *)&num,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ProbTable");
    i_1 = ComputeNumOfEntries(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_250,
                              (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                              &parent_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,child_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &num,"uniform");
    if (bVar1) {
      local_2d8 = Variable::Size((Variable *)child_00);
      for (local_2dc = 0; local_2dc < i_1; local_2dc = local_2dc + 1) {
        _j = 1.0 / (double)local_2d8;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                   (value_type_conflict3 *)&j);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &num,"identity");
      if (bVar1) {
        for (local_2ec = 0; iVar2 = Variable::Size((Variable *)child_00), local_2ec < iVar2;
            local_2ec = local_2ec + 1) {
          for (local_2f0 = 0; iVar2 = Variable::Size((Variable *)child_00), local_2f0 < iVar2;
              local_2f0 = local_2f0 + 1) {
            local_4c8 = (pointer)0x3ff0000000000000;
            if (local_2ec != local_2f0) {
              local_4c8 = (pointer)0x0;
            }
            value_tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_4c8;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                       (value_type_conflict3 *)
                       &value_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_330," ",&local_331);
        Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_310,(string *)&num,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        sVar6 = (size_type)i_1;
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_310);
        to_string<int>(&local_3d8,i_1);
        std::operator+(&local_3b8,"In <StateTransitionFunction>: ",&local_3d8);
        std::operator+(&local_398,&local_3b8," entries expected but ");
        t = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_310);
        to_string<unsigned_long>((string *)local_3f8,t);
        std::operator+(&local_378,&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f8);
        std::operator+(&local_358,&local_378," found.");
        pTVar9 = GetFirstChildElement
                           (this,(TiXmlElement *)
                                 instance.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"ProbTable");
        Ensure(this,sVar6 == sVar10,&local_358,(TiXmlBase *)pTVar9);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)local_3f8);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),sVar6);
        for (local_3fc = 0; uVar5 = (ulong)local_3fc,
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_310), uVar5 < sVar6; local_3fc = local_3fc + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(long)local_3fc);
          __nptr = (char *)std::__cxx11::string::c_str();
          dVar12 = atof(__nptr);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8)
                               ,(long)local_3fc);
          *pvVar11 = dVar12;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_310);
      }
    }
    iVar2 = (*(local_208->super_CPT).super_Function._vptr_Function[2])
                      (local_208,local_250,(undefined1 *)((long)&table.field_2 + 8));
    bVar1 = (bool)((byte)iVar2 & 1);
    local_3fd = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"In <StateTransitionFunction>: Value assignment failed.",
               &local_421);
    pTVar9 = GetFirstChildElement
                       (this,(TiXmlElement *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    Ensure(this,bVar1,&local_420,(TiXmlBase *)pTVar9);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    instance.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                            ((TiXmlNode *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&num);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_250);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_38);
  return pTVar8;
}

Assistant:

TabularCPT* Parser::CreateTabularStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else if (table == "identity") { // keyword identity
			//EnsureIdentityIsValid(); // TODO
			for (int i = 0; i < child->Size(); i++) {
				for (int j = 0; j < child->Size(); j++) {
					values.push_back(i == j);
				}
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <StateTransitionFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}